

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::create_distance3_graphs
          (Proof *this,int g,NamedVertex *p,NamedVertex *q,NamedVertex *path_from_p_to_q_1,
          NamedVertex *path_from_p_to_q_2,NamedVertex *t,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *d1_from_t,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *d2_from_t,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *d3_from_t)

{
  long *plVar1;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar2;
  pointer ppVar3;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var4;
  NamedVertex *pNVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *u;
  pointer ppVar8;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *u_3;
  key_type local_78;
  int local_54;
  NamedVertex *local_50;
  NamedVertex *local_48;
  tuple<int,_int,_int,_int> local_40;
  
  uVar2._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  local_54 = g;
  local_50 = path_from_p_to_q_1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"* adjacency ",0xc);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)
                      uVar2._M_t.
                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(p->second)._M_dataplus._M_p,(p->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," maps to ",9);
  pNVar5 = local_50;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(t->second)._M_dataplus._M_p,(t->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," in G^3 so using path ",0x16);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(pNVar5->second)._M_dataplus._M_p,(pNVar5->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," -- ",4);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(path_from_p_to_q_2->second)._M_dataplus._M_p,
                      (path_from_p_to_q_2->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(q->second)._M_dataplus._M_p,(q->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," maps to one of...\n",0x13);
  if (((this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->recover_encoding ==
      true) {
    recover_adjacency_lines(this,0,p->first,pNVar5->first,t->first);
    ppVar3 = (d1_from_t->
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar8 = (d1_from_t->
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar3; ppVar8 = ppVar8 + 1)
    {
      recover_adjacency_lines(this,0,pNVar5->first,path_from_p_to_q_2->first,ppVar8->first);
    }
    ppVar3 = (d2_from_t->
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar8 = (d2_from_t->
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar3; ppVar8 = ppVar8 + 1)
    {
      recover_adjacency_lines(this,0,path_from_p_to_q_2->first,q->first,ppVar8->first);
    }
  }
  local_48 = q;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"# 1\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"p",1);
  uVar2._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl," ",1);
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl = (_Head_base<3UL,_long,_false>)(long)t->first;
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)pNVar5->first;
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl = (long)p->first;
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
  _M_head_impl = 0;
  std::
  map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[](&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                adjacency_lines,&local_78);
  std::ostream::_M_insert<long>
            ((long)uVar2._M_t.
                   super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                   ._M_head_impl);
  ppVar3 = (d1_from_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (d1_from_t->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar3; ppVar8 = ppVar8 + 1) {
    uVar2._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream).
           _M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar2._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl," ",1);
    local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl =
         (_Head_base<3UL,_long,_false>)(long)ppVar8->first;
    local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
         (long)path_from_p_to_q_2->first;
    local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Head_base<1UL,_long,_false>._M_head_impl = (long)pNVar5->first;
    local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
    _M_head_impl = 0;
    std::
    map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[](&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  adjacency_lines,&local_78);
    poVar6 = std::ostream::_M_insert<long>
                       ((long)uVar2._M_t.
                              super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                              ._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," +",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t," 0\n",3);
  _Var4._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  plVar1 = &(_Var4._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  uVar2._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       ((_Var4._M_head_impl)->proof_stream)._M_t;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"ia 1 ~x",7);
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl = (_Head_base<3UL,_long,_false>)(long)p->first;
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)t->first;
  pmVar7 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         variable_mappings,(key_type *)&local_78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,(pmVar7->_M_dataplus)._M_p,pmVar7->_M_string_length);
  ppVar8 = (d2_from_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (d2_from_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar8 != ppVar3) {
    do {
      uVar2._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar2._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl," 1 x",4);
      local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
      super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
           (_Head_base<3UL,_long,_false>)(long)path_from_p_to_q_2->first;
      local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
      super__Head_base<2UL,_long,_false>._M_head_impl = (long)ppVar8->first;
      pmVar7 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->variable_mappings,(key_type *)&local_78);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar2._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl,(pmVar7->_M_dataplus)._M_p,pmVar7->_M_string_length);
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar3);
  }
  uVar2._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl," >= 1 ; ",8);
  poVar6 = std::ostream::_M_insert<long>
                     ((long)uVar2._M_t.
                            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                            ._M_head_impl);
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_78,1);
  _Var4._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  plVar1 = &(_Var4._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  uVar2._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       ((_Var4._M_head_impl)->proof_stream)._M_t;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"p ",2);
  std::ostream::_M_insert<long>
            ((long)uVar2._M_t.
                   super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                   ._M_head_impl);
  pNVar5 = local_48;
  ppVar3 = (d2_from_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (d2_from_t->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar3; ppVar8 = ppVar8 + 1) {
    uVar2._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream).
           _M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar2._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl," ",1);
    local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl =
         (_Head_base<3UL,_long,_false>)(long)ppVar8->first;
    local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
         (long)pNVar5->first;
    local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Head_base<1UL,_long,_false>._M_head_impl = (long)path_from_p_to_q_2->first;
    local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
    _M_head_impl = 0;
    std::
    map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[](&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  adjacency_lines,&local_78);
    poVar6 = std::ostream::_M_insert<long>
                       ((long)uVar2._M_t.
                              super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                              ._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," s +",4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t," 0\n",3);
  _Var4._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  plVar1 = &(_Var4._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)((_Var4._M_head_impl)->proof_stream)._M_t,"# 0\n",4);
  uVar2._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"ia 1 ~x",7);
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl = (_Head_base<3UL,_long,_false>)(long)p->first;
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)t->first;
  pmVar7 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         variable_mappings,(key_type *)&local_78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,(pmVar7->_M_dataplus)._M_p,pmVar7->_M_string_length);
  ppVar8 = (d3_from_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (d3_from_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar8 != ppVar3) {
    do {
      uVar2._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar2._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl," 1 x",4);
      local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
      super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
           (_Head_base<3UL,_long,_false>)(long)pNVar5->first;
      local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
      super__Head_base<2UL,_long,_false>._M_head_impl = (long)ppVar8->first;
      pmVar7 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->variable_mappings,(key_type *)&local_78);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar2._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl,(pmVar7->_M_dataplus)._M_p,pmVar7->_M_string_length);
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar3);
  }
  uVar2._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl," >= 1 ; ",8);
  poVar6 = std::ostream::_M_insert<long>
                     ((long)uVar2._M_t.
                            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                            ._M_head_impl);
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_78,1);
  _Var4._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (_Var4._M_head_impl)->proof_line + 1;
  (_Var4._M_head_impl)->proof_line =
       local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
       super__Head_base<2UL,_long,_false>._M_head_impl;
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
  _M_head_impl = (_Head_base<3UL,_int,_false>)t->first;
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = pNVar5->first;
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = p->first;
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl = (_Head_base<3UL,_long,_false>)((long)".[\\*^$\n" + 7);
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
       = local_54;
  local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       local_78.super__Tuple_impl<0UL,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
       super__Head_base<2UL,_long,_false>._M_head_impl;
  std::
  _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
  ::_M_emplace_unique<std::tuple<int,int,int,int>,std::tuple<long,long,char_const*>>
            ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
              *)&(_Var4._M_head_impl)->adjacency_lines,&local_40,
             (tuple<long,_long,_const_char_*> *)&local_78);
  return;
}

Assistant:

auto Proof::create_distance3_graphs(
    int g,
    const NamedVertex & p,
    const NamedVertex & q,
    const NamedVertex & path_from_p_to_q_1,
    const NamedVertex & path_from_p_to_q_2,
    const NamedVertex & t,
    const vector<NamedVertex> & d1_from_t,
    const vector<NamedVertex> & d2_from_t,
    const vector<NamedVertex> & d3_from_t) -> void
{
    *_imp->proof_stream << "* adjacency " << p.second << " maps to " << t.second << " in G^3 so using path " << path_from_p_to_q_1.second << " -- " << path_from_p_to_q_2.second << ", " << q.second << " maps to one of...\n";

    if (_imp->recover_encoding) {
        recover_adjacency_lines(0, p.first, path_from_p_to_q_1.first, t.first);
        for (auto & u : d1_from_t)
            recover_adjacency_lines(0, path_from_p_to_q_1.first, path_from_p_to_q_2.first, u.first);
        for (auto & u : d2_from_t)
            recover_adjacency_lines(0, path_from_p_to_q_2.first, q.first, u.first);
    }

    *_imp->proof_stream << "# 1\n";

    *_imp->proof_stream << "p";

    // if p maps to t then the first thing on the path from p to q has to go to one of...
    *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{0, p.first, path_from_p_to_q_1.first, t.first}]);
    // so the second thing on the path from p to q has to go to one of...
    for (auto & u : d1_from_t)
        *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{0, path_from_p_to_q_1.first, path_from_p_to_q_2.first, u.first}]) << " +";

    *_imp->proof_stream << " 0\n";
    ++_imp->proof_line;

    // tidy up
    *_imp->proof_stream << "ia 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}];
    for (auto & u : d2_from_t)
        *_imp->proof_stream << " 1 x" << _imp->variable_mappings[pair{path_from_p_to_q_2.first, u.first}];
    *_imp->proof_stream << " >= 1 ; " << _imp->proof_line << '\n';
    ++_imp->proof_line;

    *_imp->proof_stream << "p " << _imp->proof_line;
    for (auto & u : d2_from_t)
        *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{0, path_from_p_to_q_2.first, q.first, u.first}]) << " s +";
    *_imp->proof_stream << " 0\n";
    ++_imp->proof_line;

    *_imp->proof_stream << "# 0\n";

    *_imp->proof_stream << "ia 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}];
    for (auto & u : d3_from_t)
        *_imp->proof_stream << " 1 x" << _imp->variable_mappings[pair{q.first, u.first}];
    *_imp->proof_stream << " >= 1 ; " << _imp->proof_line << '\n';
    ++_imp->proof_line;

    _imp->adjacency_lines.emplace(tuple{g, p.first, q.first, t.first}, tuple{_imp->proof_line, _imp->proof_line, ""});
}